

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderMaxPatchVertices::iterate(TessellationShaderMaxPatchVertices *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  undefined8 local_78;
  GLfloat outer [4];
  undefined8 local_60;
  GLfloat inner [2];
  bool test_passed;
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderMaxPatchVertices *local_10;
  TessellationShaderMaxPatchVertices *this_local;
  long lVar5;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  initTest(this);
  (**(code **)(lVar5 + 0x1680))(this->m_po_id_1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glUseProgram() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x2fc);
  (**(code **)(lVar5 + 0x5e0))(0x8c89);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glEnable(RASTERIZER_DISCARD) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x2ff);
  (**(code **)(lVar5 + 0xd0))(0x8e22,this->m_tf_id_1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindTransformFeedback() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x302);
  (**(code **)(lVar5 + 0x48))(0x8c8e,0,this->m_bo_id_f_1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindBufferRange() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x305);
  (**(code **)(lVar5 + 0x48))(0x8c8e,1,this->m_bo_id_i_1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindBufferRange() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x308);
  (**(code **)(lVar5 + 0x30))(0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBeginTransformFeedback() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x30c);
  (**(code **)(lVar5 + 0x538))
            ((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,this->m_gl_max_patch_vertices);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glDrawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x30f);
  (**(code **)(lVar5 + 0x638))();
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glEndTransformFeedback() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x312);
  inner[1]._3_1_ = 1;
  (**(code **)(lVar5 + 0x40))(0x8c8e,this->m_bo_id_f_1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x318);
  bVar1 = compareResults(this,"Case 1 (explicit arrays)",this->m_ref_fv_case_1);
  inner[1]._3_1_ = (inner[1]._3_1_ & 1 & bVar1) != 0;
  (**(code **)(lVar5 + 0x40))(0x8c8e,this->m_bo_id_i_1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x31e);
  bVar1 = compareResults(this,"Case 1 (explicit arrays)",this->m_ref_iv_case_1);
  inner[1]._3_1_ = (inner[1]._3_1_ & 1 & bVar1) != 0;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  inner[0] = (GLfloat)(*pRVar4->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES((ContextType)inner[0]);
  if (!bVar1) {
    (**(code **)(lVar5 + 0x1680))(this->m_po_id_2);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glUseProgram() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x329);
    (**(code **)(lVar5 + 0xd0))(0x8e22,this->m_tf_id_2);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindTransformFeedback() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x32c);
    (**(code **)(lVar5 + 0x48))(0x8c8e,0,this->m_bo_id_f_2);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindBufferRange() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x32f);
    (**(code **)(lVar5 + 0x48))(0x8c8e,1,this->m_bo_id_i_2);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindBufferRange() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x332);
    local_60 = 0x3f8000003f800000;
    local_78 = 0x3f8000003f800000;
    outer[0] = 1.0;
    outer[1] = 1.0;
    (**(code **)(lVar5 + 0xfd0))(0x8e74,&local_78);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glPatchParameterfv() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x339);
    (**(code **)(lVar5 + 0xfd0))(0x8e73,&local_60);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glPatchParameterfv() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x33c);
    (**(code **)(lVar5 + 0x30))(0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBeginTransformFeedback(GL_POINTS) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x340);
    (**(code **)(lVar5 + 0x538))(0xe,0,this->m_gl_max_patch_vertices);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glDrawArrays() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x343);
    (**(code **)(lVar5 + 0x638))();
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glEndTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x346);
    (**(code **)(lVar5 + 0x40))(0x8c8e,this->m_bo_id_f_2);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindBuffer() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x34a);
    bVar1 = compareResults(this,"Case 2 (implicit arrays)",this->m_ref_fv_case_2);
    inner[1]._3_1_ = (inner[1]._3_1_ & 1 & bVar1) != 0;
    (**(code **)(lVar5 + 0x40))(0x8c8e,this->m_bo_id_i_2);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindBuffer() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x350);
    bVar1 = compareResults(this,"Case 2 (implicit arrays)",this->m_ref_iv_case_2);
    inner[1]._3_1_ = (inner[1]._3_1_ & 1 & bVar1) != 0;
  }
  if ((inner[1]._3_1_ & 1) != 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderMaxPatchVertices::iterate(void)
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Retrieve ES entry/state points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialization */
	initTest();

	/* Render setup case 1. */
	gl.useProgram(m_po_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed!");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(RASTERIZER_DISCARD) failed!");

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_tf_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback() failed!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_bo_id_f_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() failed!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, m_bo_id_i_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() failed!");

	/* Rendering case 1 with transform feedback.*/
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed");

	gl.drawArrays(m_glExtTokens.PATCHES, 0, m_gl_max_patch_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

	/* Compare vec4 results from transform feedback for case 1. */
	bool test_passed = true;

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_f_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

	test_passed &= compareResults("Case 1 (explicit arrays)", m_ref_fv_case_1);

	/* Compare ivec4 results from transform feedback for case 2. */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_i_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

	test_passed &= compareResults("Case 1 (explicit arrays)", m_ref_iv_case_1);

	// Case 2 tests with no TCS (default TCS is expected to be used).
	// Since this is not allowed by ES 3.1, just skip it.
	// Leaving the code for Desktop
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		/* Set up rendering for case 2. */
		gl.useProgram(m_po_id_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed!");

		gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_tf_id_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback() failed!");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id_f_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() failed!");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1 /* index */, m_bo_id_i_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() failed!");

		/* Tessellation Control Levels setup. */
		const glw::GLfloat inner[] = { 1.0, 1.0 };
		const glw::GLfloat outer[] = { 1.0, 1.0, 1.0, 1.0 };

		gl.patchParameterfv(GL_PATCH_DEFAULT_OUTER_LEVEL, outer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameterfv() failed!");

		gl.patchParameterfv(GL_PATCH_DEFAULT_INNER_LEVEL, inner);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameterfv() failed!");

		/* Rendering case 2 with transform feedback. */
		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback(GL_POINTS) failed");

		gl.drawArrays(GL_PATCHES, 0, m_gl_max_patch_vertices);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

		/* Compare vec4 results from transform feedback for case 2. */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_f_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

		test_passed &= compareResults("Case 2 (implicit arrays)", m_ref_fv_case_2);

		/* Compare ivec4 results from transform feedback for case 2. */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_i_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

		test_passed &= compareResults("Case 2 (implicit arrays)", m_ref_iv_case_2);
	}
	/* All done */
	if (test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}